

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

void __thiscall
wasm::OptimizeInstructions::visitMemoryCopy(OptimizeInstructions *this,MemoryCopy *curr)

{
  uint uVar1;
  Expression *rep;
  
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression.type.id != 1) {
    uVar1 = (((this->
              super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
              ).
              super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
              .
              super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule)->features).features;
    if ((uVar1 & 0x80010) == 0x10) {
      __assert_fail("has || !hasBulkMemory()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-features.h"
                    ,0xa5,"bool wasm::FeatureSet::hasBulkMemoryOpt() const");
    }
    if ((uVar1 >> 0x13 & 1) == 0) {
      __assert_fail("getModule()->features.hasBulkMemoryOpt()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                    ,0x51a,"void wasm::OptimizeInstructions::visitMemoryCopy(MemoryCopy *)");
    }
    rep = optimizeMemoryCopy(this,curr);
    if (rep != (Expression *)0x0) {
      replaceCurrent(this,rep);
      return;
    }
  }
  return;
}

Assistant:

void visitMemoryCopy(MemoryCopy* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }
    assert(getModule()->features.hasBulkMemoryOpt());
    if (auto* ret = optimizeMemoryCopy(curr)) {
      return replaceCurrent(ret);
    }
  }